

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O3

void __thiscall
mnf::Manifold::applyDiffRetractation(Manifold *this,RefMat *out,ConstRefMat *in,ConstRefVec *x)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  long local_18;
  long local_10;
  
  if (((((this->super_ValidManifold).flag_ == 0x677d7257) &&
       (lVar1 = (in->
                super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_cols.m_value, lVar1 == this->representationDim_)) &&
      ((out->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_cols.m_value == this->tangentDim_)) &&
     (((in->
       super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value ==
       (out->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value &&
      ((x->
       super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
       ).
       super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
       .m_rows.m_value == lVar1)))) {
    local_18 = (out->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_cols.m_value;
    local_28 = *(undefined4 *)
                &(out->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_data;
    uStack_24 = *(undefined4 *)
                 ((long)&(out->
                         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                         ).
                         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                         .
                         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                         .m_data + 4);
    uStack_20 = (undefined4)
                (out->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_rows.m_value;
    uStack_1c = *(undefined4 *)
                 ((long)&(out->
                         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                         ).
                         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                         .
                         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                         .m_rows.m_value + 4);
    local_10 = (out->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).m_stride.m_outer.m_value;
    (*this->_vptr_Manifold[0x17])(this,&local_28);
    return;
  }
  uVar2 = __cxa_allocate_exception(1);
  __cxa_throw(uVar2,&mnf_exception::typeinfo,0);
}

Assistant:

void Manifold::applyDiffRetractation(RefMat out, const ConstRefMat& in,
                                     const ConstRefVec& x) const
{
  mnf_assert(isValid() || seeMessageAbove());
  mnf_assert(in.cols() == representationDim_);
  mnf_assert(out.cols() == tangentDim_);
  mnf_assert(in.rows() == out.rows());
  mnf_assert(x.size() == representationDim_);
  applyDiffRetractation_(out, in, x);
}